

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UBool setCommonICUData(UDataMemory *pData,UBool warn,UErrorCode *pErr)

{
  UBool UVar1;
  UDataMemory *dest;
  char local_35;
  int local_34;
  UBool didUpdate;
  int32_t i;
  UDataMemory *newCommonData;
  UErrorCode *pErr_local;
  UBool warn_local;
  UDataMemory *pData_local;
  
  dest = UDataMemory_createNewInstance_63(pErr);
  local_35 = '\0';
  UVar1 = U_FAILURE(*pErr);
  if (UVar1 == '\0') {
    UDatamemory_assign_63(dest,pData);
    umtx_lock_63((UMutex *)0x0);
    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
      if (gCommonICUDataArray[local_34] == (UDataMemory *)0x0) {
        gCommonICUDataArray[local_34] = dest;
        local_35 = '\x01';
        break;
      }
      if (gCommonICUDataArray[local_34]->pHeader == pData->pHeader) break;
    }
    umtx_unlock_63((UMutex *)0x0);
    if ((local_34 == 10) && (warn != '\0')) {
      *pErr = U_USING_DEFAULT_WARNING;
    }
    if (local_35 == '\0') {
      uprv_free_63(dest);
    }
    else {
      ucln_common_registerCleanup_63(UCLN_COMMON_UDATA,udata_cleanup);
    }
    pData_local._7_1_ = local_35;
  }
  else {
    pData_local._7_1_ = '\0';
  }
  return pData_local._7_1_;
}

Assistant:

static UBool
setCommonICUData(UDataMemory *pData,     /*  The new common data.  Belongs to caller, we copy it. */
                 UBool       warn,       /*  If true, set USING_DEFAULT warning if ICUData was    */
                                         /*    changed by another thread before we got to it.     */
                 UErrorCode *pErr)
{
    UDataMemory  *newCommonData = UDataMemory_createNewInstance(pErr);
    int32_t i;
    UBool didUpdate = FALSE;
    if (U_FAILURE(*pErr)) {
        return FALSE;
    }

    /*  For the assignment, other threads must cleanly see either the old            */
    /*    or the new, not some partially initialized new.  The old can not be        */
    /*    deleted - someone may still have a pointer to it lying around in           */
    /*    their locals.                                                              */
    UDatamemory_assign(newCommonData, pData);
    umtx_lock(NULL);
    for (i = 0; i < UPRV_LENGTHOF(gCommonICUDataArray); ++i) {
        if (gCommonICUDataArray[i] == NULL) {
            gCommonICUDataArray[i] = newCommonData;
            didUpdate = TRUE;
            break;
        } else if (gCommonICUDataArray[i]->pHeader == pData->pHeader) {
            /* The same data pointer is already in the array. */
            break;
        }
    }
    umtx_unlock(NULL);

    if (i == UPRV_LENGTHOF(gCommonICUDataArray) && warn) {
        *pErr = U_USING_DEFAULT_WARNING;
    }
    if (didUpdate) {
        ucln_common_registerCleanup(UCLN_COMMON_UDATA, udata_cleanup);
    } else {
        uprv_free(newCommonData);
    }
    return didUpdate;
}